

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_statemachine(Curl_easy *data,connectdata *conn)

{
  anon_union_280_10_9f9d5394_for_proto *pp;
  ushort *puVar1;
  dynbuf *s;
  uchar *puVar2;
  ulong uVar3;
  IMAP *pIVar4;
  byte bVar5;
  uint uVar6;
  _Bool _Var7;
  unsigned_short uVar8;
  CURLcode CVar9;
  char *src;
  void *pvVar10;
  int *piVar11;
  char *pcVar12;
  size_t sVar13;
  connectdata *pcVar14;
  byte *pbVar15;
  size_t __n;
  size_t sVar16;
  size_t maxlen;
  int pop3code;
  size_t nread;
  saslprogress local_50;
  undefined4 uStack_4c;
  uint local_44;
  size_t local_40;
  size_t local_38;
  
  local_38 = 0;
  if ((conn->proto).pop3c.state == POP3_UPGRADETLS) {
    CVar9 = pop3_perform_upgrade_tls(data,conn);
    return CVar9;
  }
  pp = &conn->proto;
  if ((conn->proto).ftpc.pp.sendleft != 0) {
    CVar9 = Curl_pp_flushsend(data,&(pp->ftpc).pp);
    return CVar9;
  }
  do {
    CVar9 = Curl_pp_readresp(data,0,&(pp->ftpc).pp,(int *)&local_44,&local_38);
    uVar6 = local_44;
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if (local_44 == 0) {
      return CURLE_OK;
    }
    switch((conn->proto).pop3c.state) {
    case POP3_SERVERGREET:
      pcVar14 = data->conn;
      pcVar12 = Curl_dyn_ptr(&(pcVar14->proto).ftpc.pp.recvbuf);
      if (uVar6 != 0x2b) {
        Curl_failf(data,"Got unexpected pop3-server response");
        return CURLE_WEIRD_SERVER_REPLY;
      }
      uVar3 = (data->conn->proto).ftpc.pp.nfinal;
      if (3 < uVar3) {
        src = (char *)memchr(pcVar12,0x3c,uVar3);
        if ((src != (char *)0x0) &&
           (pvVar10 = memchr(src,0x3e,(size_t)(pcVar12 + (uVar3 - (long)src))),
           pvVar10 != (void *)0x0)) {
          __n = (long)pvVar10 + (1 - (long)src);
          pvVar10 = memchr(src,0x40,__n);
          if (pvVar10 != (void *)0x0) {
            pvVar10 = Curl_memdup0(src,__n);
            (pcVar14->proto).imapc.dyn.toobig = (size_t)pvVar10;
            if (pvVar10 == (void *)0x0) {
              return CURLE_OUT_OF_MEMORY;
            }
            puVar2 = &(pcVar14->proto).pop3c.authtypes;
            *puVar2 = *puVar2 | 2;
          }
        }
        CVar9 = pop3_perform_capa(data,pcVar14);
        break;
      }
      goto LAB_00149244;
    case POP3_CAPA:
      pcVar14 = data->conn;
      piVar11 = (int *)Curl_dyn_ptr(&(pcVar14->proto).ftpc.pp.recvbuf);
      if (uVar6 != 0x2b) {
        if (uVar6 == 0x2a) {
          uVar3 = (data->conn->proto).ftpc.pp.nfinal;
          if (3 < uVar3) {
            if (*piVar11 == 0x534c5453) {
              pbVar15 = (byte *)((long)&pcVar14->proto + 0xe2);
              *pbVar15 = *pbVar15 | 2;
            }
            else if (*piVar11 == 0x52455355) {
              puVar2 = &(pcVar14->proto).pop3c.authtypes;
              *puVar2 = *puVar2 | 1;
            }
            else if ((uVar3 != 4) && ((char)piVar11[1] == ' ' && *piVar11 == 0x4c534153)) {
              puVar2 = &(pcVar14->proto).pop3c.authtypes;
              *puVar2 = *puVar2 | 4;
              sVar13 = uVar3 - 5;
              if (sVar13 != 0) {
                pbVar15 = (byte *)((long)piVar11 + 5);
                do {
                  while (((ulong)*pbVar15 < 0x21 &&
                         ((0x100002600U >> ((ulong)*pbVar15 & 0x3f) & 1) != 0))) {
                    pbVar15 = pbVar15 + 1;
                    sVar13 = sVar13 - 1;
                    if (sVar13 == 0) goto LAB_00149244;
                  }
                  sVar16 = 0;
                  do {
                    if (((ulong)pbVar15[sVar16] < 0x21) &&
                       (maxlen = sVar16, (0x100002600U >> ((ulong)pbVar15[sVar16] & 0x3f) & 1) != 0)
                       ) break;
                    sVar16 = sVar16 + 1;
                    maxlen = sVar13;
                  } while (sVar13 != sVar16);
                  local_40 = sVar13;
                  uVar8 = Curl_sasl_decode_mech((char *)pbVar15,maxlen,(size_t *)&local_50);
                  if ((uVar8 != 0) && (CONCAT44(uStack_4c,local_50) == maxlen)) {
                    puVar1 = (ushort *)((long)&pcVar14->proto + 0xd0);
                    *puVar1 = *puVar1 | uVar8;
                  }
                  pbVar15 = pbVar15 + maxlen;
                  sVar13 = local_40 - maxlen;
                } while (sVar13 != 0);
              }
            }
          }
          goto LAB_00149244;
        }
        puVar2 = &(pcVar14->proto).pop3c.authtypes;
        *puVar2 = *puVar2 | 1;
      }
      if (((data->set).use_ssl != '\0') && (_Var7 = Curl_conn_is_ssl(pcVar14,0), !_Var7)) {
        if ((uVar6 == 0x2b) && ((*(byte *)((long)&pcVar14->proto + 0xe2) & 2) != 0)) {
          CVar9 = Curl_pp_sendf(data,&(pcVar14->proto).ftpc.pp,"%s","STLS");
          if (CVar9 != CURLE_OK) {
            return CVar9;
          }
          (data->conn->proto).pop3c.state = POP3_STARTTLS;
          goto LAB_00149244;
        }
        if (1 < (data->set).use_ssl) {
          pcVar12 = "STLS not supported.";
LAB_00149385:
          Curl_failf(data,pcVar12);
          return CURLE_USE_SSL_FAILED;
        }
      }
LAB_0014919b:
      CVar9 = pop3_perform_authentication(data,pcVar14);
      break;
    case POP3_STARTTLS:
      if ((data->conn->proto).ftpc.pp.overflow != 0) {
        return CURLE_WEIRD_SERVER_REPLY;
      }
      if (local_44 != 0x2b) {
        pcVar14 = conn;
        if ((data->set).use_ssl != '\x01') {
          pcVar12 = "STARTTLS denied";
          goto LAB_00149385;
        }
        goto LAB_0014919b;
      }
      CVar9 = pop3_perform_upgrade_tls(data,conn);
      break;
    default:
      goto switchD_00148e33_caseD_4;
    case POP3_AUTH:
      pcVar14 = data->conn;
      CVar9 = Curl_sasl_continue((SASL *)&(pcVar14->proto).imapc.sasl.authmechs,data,local_44,
                                 &local_50);
      if (CVar9 == CURLE_OK) {
        if (local_50 == SASL_IDLE) {
          bVar5 = (pcVar14->proto).pop3c.preftype & (pcVar14->proto).pop3c.authtypes;
          if ((bVar5 & 2) == 0) {
            if ((bVar5 & 1) == 0) {
              Curl_failf(data,"Authentication cancelled");
              CVar9 = CURLE_LOGIN_DENIED;
            }
            else {
              CVar9 = pop3_perform_user(data,pcVar14);
            }
          }
          else {
            CVar9 = pop3_perform_apop(data,pcVar14);
          }
        }
        else {
          CVar9 = CURLE_OK;
          if (local_50 == SASL_DONE) {
            (data->conn->proto).pop3c.state = POP3_STOP;
          }
        }
      }
      break;
    case POP3_APOP:
      if (local_44 != 0x2b) {
        pcVar12 = "Authentication failed: %d";
        goto LAB_00149361;
      }
      goto switchD_00148e33_caseD_4;
    case POP3_USER:
      if (local_44 != 0x2b) {
LAB_00149339:
        pcVar12 = "Access denied. %c";
LAB_00149361:
        Curl_failf(data,pcVar12,(ulong)local_44);
        return CURLE_LOGIN_DENIED;
      }
      pcVar12 = data->conn->passwd;
      if (pcVar12 == (char *)0x0) {
        pcVar12 = "";
      }
      CVar9 = Curl_pp_sendf(data,&(data->conn->proto).ftpc.pp,"PASS %s",pcVar12);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      (data->conn->proto).pop3c.state = POP3_PASS;
      goto LAB_00149244;
    case POP3_PASS:
      if (local_44 != 0x2b) goto LAB_00149339;
switchD_00148e33_caseD_4:
      (data->conn->proto).pop3c.state = POP3_STOP;
      goto LAB_00149244;
    case POP3_COMMAND:
      pcVar14 = data->conn;
      CVar9 = CURLE_WEIRD_SERVER_REPLY;
      if (local_44 == 0x2b) {
        pIVar4 = (data->req).p.imap;
        (pcVar14->proto).pop3c.eob = 2;
        (pcVar14->proto).pop3c.strip = 2;
        if (pIVar4->transfer == PPTRANSFER_BODY) {
          Curl_xfer_setup1(data,1,-1,false);
          sVar13 = (pcVar14->proto).ftpc.pp.overflow;
          if (sVar13 != 0) {
            s = &(pcVar14->proto).ftpc.pp.recvbuf;
            Curl_dyn_tail(s,sVar13);
            (pcVar14->proto).ftpc.pp.nfinal = 0;
            if (((data->req).field_0xdb & 2) == 0) {
              pcVar12 = Curl_dyn_ptr(s);
              sVar13 = Curl_dyn_len(s);
              CVar9 = pop3_write(data,pcVar12,sVar13,false);
              if (CVar9 != CURLE_OK) {
                return CVar9;
              }
            }
            Curl_dyn_reset(s);
            goto LAB_00149224;
          }
        }
        else {
LAB_00149224:
          (pcVar14->proto).ftpc.pp.overflow = 0;
        }
        pcVar14 = data->conn;
        CVar9 = CURLE_OK;
      }
      (pcVar14->proto).pop3c.state = POP3_STOP;
    }
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
LAB_00149244:
    if ((conn->proto).pop3c.state == POP3_STOP) {
      return CURLE_OK;
    }
    _Var7 = Curl_pp_moredata(&(pp->ftpc).pp);
    if (!_Var7) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

static CURLcode pop3_statemachine(struct Curl_easy *data,
                                  struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  int pop3code;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;
  size_t nread = 0;
  (void)data;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not POP3 */
  if(pop3c->state == POP3_UPGRADETLS)
    return pop3_perform_upgrade_tls(data, conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(data, pp);

 do {
    /* Read the response from the server */
   result = Curl_pp_readresp(data, FIRSTSOCKET, pp, &pop3code, &nread);
   if(result)
     return result;

    if(!pop3code)
      break;

    /* We have now received a full POP3 server response */
    switch(pop3c->state) {
    case POP3_SERVERGREET:
      result = pop3_state_servergreet_resp(data, pop3code, pop3c->state);
      break;

    case POP3_CAPA:
      result = pop3_state_capa_resp(data, pop3code, pop3c->state);
      break;

    case POP3_STARTTLS:
      result = pop3_state_starttls_resp(data, conn, pop3code, pop3c->state);
      break;

    case POP3_AUTH:
      result = pop3_state_auth_resp(data, pop3code, pop3c->state);
      break;

#ifndef CURL_DISABLE_DIGEST_AUTH
    case POP3_APOP:
      result = pop3_state_apop_resp(data, pop3code, pop3c->state);
      break;
#endif

    case POP3_USER:
      result = pop3_state_user_resp(data, pop3code, pop3c->state);
      break;

    case POP3_PASS:
      result = pop3_state_pass_resp(data, pop3code, pop3c->state);
      break;

    case POP3_COMMAND:
      result = pop3_state_command_resp(data, pop3code, pop3c->state);
      break;

    case POP3_QUIT:
      pop3_state(data, POP3_STOP);
      break;

    default:
      /* internal error */
      pop3_state(data, POP3_STOP);
      break;
    }
  } while(!result && pop3c->state != POP3_STOP && Curl_pp_moredata(pp));

  return result;
}